

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int m_encode_zero(aec_stream *strm)

{
  internal_state *state_00;
  int iVar1;
  aec_stream *in_RDI;
  internal_state *state;
  
  state_00 = in_RDI->state;
  emit(state_00,0,state_00->id_len + 1);
  if (state_00->zero_ref != 0) {
    emit(state_00,state_00->zero_ref_sample,in_RDI->bits_per_sample);
  }
  if (state_00->zero_blocks == -1) {
    emitfs(state_00,4);
  }
  else if (state_00->zero_blocks < 5) {
    emitfs(state_00,state_00->zero_blocks + -1);
  }
  else {
    emitfs(state_00,state_00->zero_blocks);
  }
  state_00->zero_blocks = 0;
  iVar1 = m_flush_block(in_RDI);
  return iVar1;
}

Assistant:

static int m_encode_zero(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    emit(state, 0, state->id_len + 1);

    if (state->zero_ref)
        emit(state, state->zero_ref_sample, strm->bits_per_sample);

    if (state->zero_blocks == ROS)
        emitfs(state, 4);
    else if (state->zero_blocks >= 5)
        emitfs(state, state->zero_blocks);
    else
        emitfs(state, state->zero_blocks - 1);

    state->zero_blocks = 0;
    return m_flush_block(strm);
}